

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::ConvolveHorizRSTestBase<unsigned_char>::Prep
          (ConvolveHorizRSTestBase<unsigned_char> *this,ACMRandom *rnd)

{
  ACMRandom *in_stack_00000028;
  TestImage<unsigned_char> *in_stack_00000030;
  
  TestImage<unsigned_char>::Initialize(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void Prep(ACMRandom *rnd) {
    assert(rnd);
    image_->Initialize(rnd);
  }